

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 float32_add_s390x(float32 a,float32 b,float_status *s)

{
  float32 fVar1;
  float_status *s_local;
  float32 b_local;
  float32 a_local;
  
  fVar1 = float32_gen2(a,b,s,hard_f32_add,soft_f32_add,f32_is_zon2,f32_addsub_post,(f32_check_fn)0x0
                       ,(soft_f32_op2_fn)0x0);
  return fVar1;
}

Assistant:

float32 QEMU_FLATTEN
float32_add(float32 a, float32 b, float_status *s)
{
    return float32_addsub(a, b, s, hard_f32_add, soft_f32_add);
}